

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

vector<MPLSParser,_std::allocator<MPLSParser>_> * __thiscall
METADemuxer::getMplsInfo
          (vector<MPLSParser,_std::allocator<MPLSParser>_> *__return_storage_ptr__,METADemuxer *this
          ,string *mplsFileName)

{
  bool bVar1;
  char *pcVar2;
  pointer ppVar3;
  ostream *poVar4;
  VodCoreException *this_00;
  mapped_type *this_01;
  string local_2e8;
  ostringstream local_2c8 [8];
  ostringstream ss;
  string local_150;
  undefined1 local_130 [8];
  MPLSParser parser;
  _Self local_78;
  iterator itr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mplsFiles;
  string *mplsFileName_local;
  METADemuxer *this_local;
  vector<MPLSParser,_std::allocator<MPLSParser>_> *result;
  
  mplsFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<MPLSParser,_std::allocator<MPLSParser>_>::vector(__return_storage_ptr__);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  splitQuotedStr_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,pcVar2,'+');
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
  i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar1) {
      mplsFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      if ((mplsFiles.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    itr._M_node = (_Base_ptr)
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
         ::find(&this->m_mplsStreamMap,(key_type *)itr._M_node);
    parser.m_mvcFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
                  ::end(&this->m_mplsStreamMap);
    bVar1 = std::operator!=(&local_78,
                            (_Self *)&parser.m_mvcFiles.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>
               ::operator->(&local_78);
      std::vector<MPLSParser,_std::allocator<MPLSParser>_>::push_back
                (__return_storage_ptr__,&ppVar3->second);
    }
    else {
      MPLSParser::MPLSParser((MPLSParser *)local_130);
      unquoteStr(&local_150,(string *)itr._M_node);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      bVar1 = MPLSParser::parse((MPLSParser *)local_130,pcVar2);
      std::__cxx11::string::~string((string *)&local_150);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_2c8);
        poVar4 = std::operator<<((ostream *)local_2c8,"Can\'t parse play list file ");
        std::operator<<(poVar4,(string *)itr._M_node);
        this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(this_00,3,&local_2e8);
        __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
                ::operator[](&this->m_mplsStreamMap,(key_type *)itr._M_node);
      MPLSParser::operator=(this_01,(MPLSParser *)local_130);
      std::vector<MPLSParser,_std::allocator<MPLSParser>_>::push_back
                (__return_storage_ptr__,(value_type *)local_130);
      MPLSParser::~MPLSParser((MPLSParser *)local_130);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::vector<MPLSParser> METADemuxer::getMplsInfo(const string& mplsFileName)
{
    std::vector<MPLSParser> result;

    std::vector<std::string> mplsFiles = splitQuotedStr(mplsFileName.c_str(), '+');
    for (auto& i : mplsFiles)
    {
        auto itr = m_mplsStreamMap.find(i);
        if (itr != m_mplsStreamMap.end())
            result.push_back(itr->second);
        else
        {
            MPLSParser parser;
            if (!parser.parse(unquoteStr(i).c_str()))
                THROW(ERR_COMMON, "Can't parse play list file " << i)
            m_mplsStreamMap[i] = parser;
            result.push_back(parser);
        }
    }
    return result;
}